

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginGlobal(WatWriter *this,Global *global)

{
  NextChar in_R8D;
  string_view str;
  
  WritePuts(this,"(",None);
  WritePuts(this,"global",Space);
  this->indent_ = this->indent_ + 2;
  str._M_str = (global->name)._M_dataplus._M_p;
  str._M_len = (global->name)._M_string_length;
  WriteNameOrIndex(this,str,this->global_index_,in_R8D);
  WriteInlineExports(this,Global,this->global_index_);
  WriteInlineImport(this,Global,this->global_index_);
  if (global->mutable_ == true) {
    WritePuts(this,"(",None);
    WritePuts(this,"mut",Space);
    this->indent_ = this->indent_ + 2;
    WriteType(this,global->type,Space);
    WriteClose(this,Space);
  }
  else {
    WriteType(this,global->type,Space);
  }
  this->global_index_ = this->global_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginGlobal(const Global& global) {
  WriteOpenSpace("global");
  WriteNameOrIndex(global.name, global_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Global, global_index_);
  WriteInlineImport(ExternalKind::Global, global_index_);
  if (global.mutable_) {
    WriteOpenSpace("mut");
    WriteType(global.type, NextChar::Space);
    WriteCloseSpace();
  } else {
    WriteType(global.type, NextChar::Space);
  }
  global_index_++;
}